

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifcstr(bifcxdef *ctx,char *buf,size_t bufsiz,uchar *str)

{
  int iVar1;
  uint uVar2;
  void *in_RCX;
  long in_RDX;
  runcxdef *in_RSI;
  long in_RDI;
  char *dst;
  uchar *src;
  size_t dstrem;
  size_t srcrem;
  uint in_stack_ffffffffffffffbc;
  uint err;
  byte *local_38;
  long local_30;
  long local_28;
  
  iVar1 = osrp2(in_RCX);
  local_28 = (long)(iVar1 + -2);
  local_38 = (byte *)((long)in_RCX + 2);
  local_30 = in_RDX;
  do {
    err = in_stack_ffffffffffffffbc & 0xffffff;
    if (local_28 != 0) {
      err = CONCAT13(local_30 != 0,(int3)in_stack_ffffffffffffffbc);
    }
    if ((char)(err >> 0x18) == '\0') goto LAB_001368a4;
    if (*local_38 == 0x5c) {
      local_38 = local_38 + 1;
      local_28 = local_28 + -1;
      if (local_28 == 0) {
        *(undefined1 *)&in_RSI->runcxerr = 0x5c;
        local_30 = local_30 + -1;
        in_RSI = (runcxdef *)((long)&in_RSI->runcxerr + 1);
LAB_001368a4:
        if (local_30 != 0) {
          *(undefined1 *)&in_RSI->runcxerr = 0;
          return;
        }
        *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
        runsign(in_RSI,err);
      }
      uVar2 = (uint)*local_38;
      if (1 < uVar2 - 0x28) {
        if (uVar2 == 0x6e) {
          *(undefined1 *)&in_RSI->runcxerr = 10;
          local_30 = local_30 + -1;
          in_RSI = (runcxdef *)((long)&in_RSI->runcxerr + 1);
        }
        else if (uVar2 == 0x74) {
          *(undefined1 *)&in_RSI->runcxerr = 9;
          local_30 = local_30 + -1;
          in_RSI = (runcxdef *)((long)&in_RSI->runcxerr + 1);
        }
        else {
          *(byte *)&in_RSI->runcxerr = *local_38;
          local_30 = local_30 + -1;
          in_RSI = (runcxdef *)((long)&in_RSI->runcxerr + 1);
        }
      }
    }
    else {
      *(byte *)&in_RSI->runcxerr = *local_38;
      local_30 = local_30 + -1;
      in_RSI = (runcxdef *)((long)&in_RSI->runcxerr + 1);
    }
    local_38 = local_38 + 1;
    local_28 = local_28 + -1;
    in_stack_ffffffffffffffbc = err;
  } while( true );
}

Assistant:

static void bifcstr(bifcxdef *ctx, char *buf, size_t bufsiz, uchar *str)
{
    size_t  srcrem;
    size_t  dstrem;
    uchar  *src;
    char   *dst;

    /* get the length and text portion of the string */
    srcrem = osrp2(str) - 2;
    str += 2;

    /* scan the string, and convert escapes */
    for (src = str, dst = buf, dstrem = bufsiz ;
         srcrem != 0 && dstrem != 0 ; ++src, --srcrem)
    {
        /* if we have an escape sequence, convert it */
        if (*src == '\\')
        {
            /* skip the backslash in the input */
            ++src;
            --srcrem;

            /* if there's nothing left, store the backslash */
            if (srcrem == 0)
            {
                /* store the backslash */
                *dst++ = '\\';
                --dstrem;

                /* there's nothing left to scan */
                break;
            }

            /* see what the second half of the escape sequence is */
            switch(*src)
            {
            case 'n':
                /* store a C-style newline character */
                *dst++ = '\n';
                --dstrem;
                break;

            case 't':
                /* store a C-style tab */
                *dst++ = '\t';
                --dstrem;
                break;

            case '(':
            case ')':
                /* entirely omit the highlighting sequences */
                break;

            default:
                /* store everything else unchanged */
                *dst++ = *src;
                --dstrem;
                break;
            }
        }
        else
        {
            /* copy this character unchanged */
            *dst++ = *src;
            --dstrem;
        }
    }

    /* if the buffer wasn't big enough, signal an error */
    if (dstrem == 0)
        runsig(ctx->bifcxrun, ERR_BIFCSTR);

    /* null-terminate the result string */
    *dst = '\0';
}